

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hxx
# Opt level: O0

int system(char *__command)

{
  char *pcVar1;
  FILE *__stream;
  char local_58 [8];
  char result [24];
  FILE *cmd;
  string *command_local;
  string *coutput;
  
  std::__cxx11::string::string((string *)__command);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __stream = popen(pcVar1,"r");
  memset(local_58,0,0x18);
  while (pcVar1 = fgets(local_58,0x18,__stream), pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)__command,local_58);
  }
  pclose(__stream);
  return (int)__command;
}

Assistant:

static inline string system(const string & command)
{
  string coutput;
  FILE *cmd = popen(command.c_str(), "r");
  char result[24] = { 0x0 };
  while (fgets(result, sizeof(result), cmd) != NULL)
    coutput += result;
  pclose(cmd);
  return coutput;
}